

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void Load8x4_SSE2(uint8_t *b,int stride,__m128i *p,__m128i *q)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined6 uVar3;
  undefined6 uVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  __m128i C1;
  __m128i C0;
  __m128i B1;
  __m128i B0;
  __m128i A1;
  __m128i A0;
  undefined1 local_108;
  undefined1 uStack_107;
  undefined1 uStack_106;
  undefined1 uStack_105;
  undefined1 uStack_104;
  undefined1 uStack_103;
  undefined1 uStack_102;
  undefined1 uStack_101;
  undefined1 local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined4 uStack_a4;
  undefined4 uStack_94;
  undefined4 uStack_7c;
  undefined4 uStack_6c;
  undefined1 uStack_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  
  iVar5 = WebPMemToInt32((uint8_t *)0x134246);
  iVar6 = WebPMemToInt32((uint8_t *)0x134265);
  iVar7 = WebPMemToInt32((uint8_t *)0x134285);
  iVar8 = WebPMemToInt32((uint8_t *)0x134296);
  iVar9 = WebPMemToInt32((uint8_t *)0x134323);
  iVar10 = WebPMemToInt32((uint8_t *)0x134345);
  iVar11 = WebPMemToInt32((uint8_t *)0x134367);
  iVar12 = WebPMemToInt32((uint8_t *)0x134383);
  local_f8 = (undefined1)iVar8;
  uStack_f7 = (undefined1)((uint)iVar8 >> 8);
  uStack_f6 = (undefined1)((uint)iVar8 >> 0x10);
  uStack_f5 = (undefined1)((uint)iVar8 >> 0x18);
  uStack_f4 = (undefined1)iVar7;
  uStack_f3 = (undefined1)((uint)iVar7 >> 8);
  uStack_f2 = (undefined1)((uint)iVar7 >> 0x10);
  uStack_f1 = (undefined1)((uint)iVar7 >> 0x18);
  local_108 = (undefined1)iVar12;
  uStack_107 = (undefined1)((uint)iVar12 >> 8);
  uStack_106 = (undefined1)((uint)iVar12 >> 0x10);
  uStack_105 = (undefined1)((uint)iVar12 >> 0x18);
  uStack_104 = (undefined1)iVar11;
  uStack_103 = (undefined1)((uint)iVar11 >> 8);
  uStack_102 = (undefined1)((uint)iVar11 >> 0x10);
  uStack_101 = (undefined1)((uint)iVar11 >> 0x18);
  uStack_50 = (undefined1)iVar6;
  uStack_4f = (undefined1)((uint)iVar6 >> 8);
  uStack_4e = (undefined1)((uint)iVar6 >> 0x10);
  uStack_4d = (undefined1)((uint)iVar6 >> 0x18);
  uStack_4c = (undefined1)iVar5;
  uStack_4b = (undefined1)((uint)iVar5 >> 8);
  uStack_4a = (undefined1)((uint)iVar5 >> 0x10);
  uStack_49 = (undefined1)((uint)iVar5 >> 0x18);
  uStack_60 = (undefined1)iVar10;
  uStack_5f = (undefined1)((uint)iVar10 >> 8);
  uStack_5e = (undefined1)((uint)iVar10 >> 0x10);
  uStack_5d = (undefined1)((uint)iVar10 >> 0x18);
  uStack_5c = (undefined1)iVar9;
  uStack_5b = (undefined1)((uint)iVar9 >> 8);
  uStack_5a = (undefined1)((uint)iVar9 >> 0x10);
  uStack_59 = (undefined1)((uint)iVar9 >> 0x18);
  uVar2 = CONCAT13(uStack_107,CONCAT12(uStack_f7,CONCAT11(local_108,local_f8)));
  uVar4 = CONCAT15(uStack_106,CONCAT14(uStack_f6,uVar2));
  uVar1 = CONCAT13(uStack_5f,CONCAT12(uStack_4f,CONCAT11(uStack_60,uStack_50)));
  uVar3 = CONCAT15(uStack_5e,CONCAT14(uStack_4e,uVar1));
  uStack_d6 = (undefined2)((uint)uVar2 >> 0x10);
  uStack_d4 = (undefined2)((uint6)uVar4 >> 0x20);
  uStack_d2 = (undefined2)(CONCAT17(uStack_105,CONCAT16(uStack_f5,uVar4)) >> 0x30);
  uStack_e6 = (undefined2)((uint)uVar1 >> 0x10);
  uStack_e4 = (undefined2)((uint6)uVar3 >> 0x20);
  uStack_e2 = (undefined2)(CONCAT17(uStack_5d,CONCAT16(uStack_4d,uVar3)) >> 0x30);
  uVar2 = CONCAT13(uStack_103,CONCAT12(uStack_f3,CONCAT11(uStack_104,uStack_f4)));
  uVar4 = CONCAT15(uStack_102,CONCAT14(uStack_f2,uVar2));
  uVar1 = CONCAT13(uStack_5b,CONCAT12(uStack_4b,CONCAT11(uStack_5c,uStack_4c)));
  uVar3 = CONCAT15(uStack_5a,CONCAT14(uStack_4a,uVar1));
  uStack_ae = (undefined2)((uint)uVar2 >> 0x10);
  uStack_ac = (undefined2)((uint6)uVar4 >> 0x20);
  uStack_aa = (undefined2)(CONCAT17(uStack_101,CONCAT16(uStack_f1,uVar4)) >> 0x30);
  uStack_be = (undefined2)((uint)uVar1 >> 0x10);
  uStack_bc = (undefined2)((uint6)uVar3 >> 0x20);
  uStack_ba = (undefined2)(CONCAT17(uStack_59,CONCAT16(uStack_49,uVar3)) >> 0x30);
  uVar2 = CONCAT22(CONCAT11(uStack_60,uStack_50),CONCAT11(local_108,local_f8));
  uVar1 = CONCAT22(CONCAT11(uStack_5c,uStack_4c),CONCAT11(uStack_104,uStack_f4));
  uStack_94 = (undefined4)(CONCAT26(uStack_e6,CONCAT24(uStack_d6,uVar2)) >> 0x20);
  uStack_a4 = (undefined4)(CONCAT26(uStack_be,CONCAT24(uStack_ae,uVar1)) >> 0x20);
  *in_RDX = uVar2;
  in_RDX[1] = uVar1;
  in_RDX[2] = uStack_94;
  in_RDX[3] = uStack_a4;
  uStack_6c = (undefined4)
              (CONCAT26(uStack_e2,CONCAT24(uStack_d2,CONCAT22(uStack_e4,uStack_d4))) >> 0x20);
  uStack_7c = (undefined4)
              (CONCAT26(uStack_ba,CONCAT24(uStack_aa,CONCAT22(uStack_bc,uStack_ac))) >> 0x20);
  *in_RCX = CONCAT22(uStack_e4,uStack_d4);
  in_RCX[1] = CONCAT22(uStack_bc,uStack_ac);
  in_RCX[2] = uStack_6c;
  in_RCX[3] = uStack_7c;
  return;
}

Assistant:

static WEBP_INLINE void Load8x4_SSE2(const uint8_t* const b, int stride,
                                     __m128i* const p, __m128i* const q) {
  // A0 = 63 62 61 60 23 22 21 20 43 42 41 40 03 02 01 00
  // A1 = 73 72 71 70 33 32 31 30 53 52 51 50 13 12 11 10
  const __m128i A0 = _mm_set_epi32(
      WebPMemToInt32(&b[6 * stride]), WebPMemToInt32(&b[2 * stride]),
      WebPMemToInt32(&b[4 * stride]), WebPMemToInt32(&b[0 * stride]));
  const __m128i A1 = _mm_set_epi32(
      WebPMemToInt32(&b[7 * stride]), WebPMemToInt32(&b[3 * stride]),
      WebPMemToInt32(&b[5 * stride]), WebPMemToInt32(&b[1 * stride]));

  // B0 = 53 43 52 42 51 41 50 40 13 03 12 02 11 01 10 00
  // B1 = 73 63 72 62 71 61 70 60 33 23 32 22 31 21 30 20
  const __m128i B0 = _mm_unpacklo_epi8(A0, A1);
  const __m128i B1 = _mm_unpackhi_epi8(A0, A1);

  // C0 = 33 23 13 03 32 22 12 02 31 21 11 01 30 20 10 00
  // C1 = 73 63 53 43 72 62 52 42 71 61 51 41 70 60 50 40
  const __m128i C0 = _mm_unpacklo_epi16(B0, B1);
  const __m128i C1 = _mm_unpackhi_epi16(B0, B1);

  // *p = 71 61 51 41 31 21 11 01 70 60 50 40 30 20 10 00
  // *q = 73 63 53 43 33 23 13 03 72 62 52 42 32 22 12 02
  *p = _mm_unpacklo_epi32(C0, C1);
  *q = _mm_unpackhi_epi32(C0, C1);
}